

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.c
# Opt level: O0

void shift_buffer(ptls_buffer_t *buf,size_t delta)

{
  size_t delta_local;
  ptls_buffer_t *buf_local;
  
  if (delta != 0) {
    if (buf->off < delta) {
      __assert_fail("delta <= buf->off",
                    "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/cli.c",
                    0x3b,"void shift_buffer(ptls_buffer_t *, size_t)");
    }
    if (delta != buf->off) {
      memmove(buf->base,buf->base + delta,buf->off - delta);
    }
    buf->off = buf->off - delta;
  }
  return;
}

Assistant:

static void shift_buffer(ptls_buffer_t *buf, size_t delta)
{
    if (delta != 0) {
        assert(delta <= buf->off);
        if (delta != buf->off)
            memmove(buf->base, buf->base + delta, buf->off - delta);
        buf->off -= delta;
    }
}